

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>,unsigned_int>
               (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  bool bVar1;
  const_reference cVar2;
  uint rowIndex;
  undefined **local_200;
  ulong local_1f8;
  shared_count sStack_1f0;
  char **local_1e8;
  char *local_1e0;
  _Base_ptr local_1d8;
  shared_count sStack_1d0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1c8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>>
            ((column_content<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL>_>_>
              *)&local_1c8,col);
  bVar1 = std::operator==(&local_1c8,&setcont->_M_t);
  local_1d8 = (_Base_ptr)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_130 = "get_column_content_via_iterators(col) == setcont";
  local_128 = "";
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_001c0390;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_1e8 = &local_130;
  local_1e0._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  local_198 = setcont;
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1c8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
  ::get_content((vector<bool,_std::allocator<bool>_> *)&local_1c8,col,
                (*(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                *(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  bVar1 = std::operator==((vector<bool,_std::allocator<bool>_> *)&local_1c8,veccont);
  local_1e0 = (char *)CONCAT71(local_1e0._1_7_,bVar1);
  local_1d8 = (_Base_ptr)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_130 = "col.get_content(veccont.size()) == veccont";
  local_128 = "";
  local_1f8 = local_1f8 & 0xffffffffffffff00;
  local_200 = &PTR__lazy_ostream_001c0390;
  sStack_1f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_1e8 = &local_130;
  boost::test_tools::tt_detail::report_assertion
            ((_Base_ptr)&local_1e0,&local_200,&local_90,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&local_1c8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x120);
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1c8._M_impl._0_8_ = &PTR__lazy_ostream_001c0420;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x17f184;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_200 = (undefined **)
              (col->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_1e0 = (char *)(local_198->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_1c8,&local_c0,0x120,1,2,&local_200,"col.size()",(_Base_ptr)&local_1e0,
             "setcont.size()");
  if (((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size == 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1e0 = "col.is_empty()";
    local_1d8 = (_Base_ptr)0x17fd70;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1c8._M_impl._0_8_ = &PTR__lazy_ostream_001c0390;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_1e0;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_200 = (undefined **)
                CONCAT71(local_200._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size != 0);
    local_1f8 = 0;
    sStack_1f0.pi_ = (sp_counted_base *)0x0;
    local_1e0 = "!col.is_empty()";
    local_1d8 = (_Base_ptr)0x17fd70;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1c8._M_impl._0_8_ = &PTR__lazy_ostream_001c0390;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = "";
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_1e0;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1f0);
  for (rowIndex = 0;
      (ulong)rowIndex <
      (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8; rowIndex = rowIndex + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](veccont,(ulong)rowIndex);
    if (cVar2) {
      local_170 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_168 = "";
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,300,&local_180);
      bVar1 = Gudhi::persistence_matrix::
              Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
              ::is_non_zero(col,rowIndex);
      local_200 = (undefined **)CONCAT71(local_200._1_7_,bVar1);
      local_1f8 = 0;
      sStack_1f0.pi_ = (sp_counted_base *)0x0;
      local_1e0 = "col.is_non_zero(i)";
      local_1d8 = (_Base_ptr)0x17fd84;
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      local_1c8._M_impl._0_8_ = &PTR__lazy_ostream_001c0390;
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
      local_190 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_188 = "";
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_1e0;
      boost::test_tools::tt_detail::report_assertion(&local_200,&local_1c8,&local_190,300,1,0,0);
    }
    else {
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_138 = "";
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x12a,&local_150)
      ;
      bVar1 = Gudhi::persistence_matrix::
              Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
              ::is_non_zero(col,rowIndex);
      local_200 = (undefined **)CONCAT71(local_200._1_7_,!bVar1);
      local_1f8 = 0;
      sStack_1f0.pi_ = (sp_counted_base *)0x0;
      local_1e0 = "!col.is_non_zero(i)";
      local_1d8 = (_Base_ptr)0x17fd84;
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      local_1c8._M_impl._0_8_ = &PTR__lazy_ostream_001c0390;
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
      local_160 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_158 = "";
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_1e0;
      boost::test_tools::tt_detail::report_assertion(&local_200,&local_1c8,&local_160,0x12a,1,0,0);
    }
    boost::detail::shared_count::~shared_count(&sStack_1f0);
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}